

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

array<char,_4UL> QLocalePrivate::languageToCode(Language language,LanguageCodeTypes codeTypes)

{
  bool bVar1;
  array<char,_4UL> aVar2;
  long *plVar3;
  const_reference this;
  ushort in_DI;
  long in_FS_OFFSET;
  LanguageCodeEntry *i;
  LanguageCodeType in_stack_ffffffffffffffcc;
  AlphaCode *in_stack_ffffffffffffffd0;
  size_type in_stack_ffffffffffffffd8;
  undefined1 local_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_DI == 0) || (0x15a < in_DI)) {
    memset(local_c,0,4);
  }
  else if (in_DI == 1) {
    local_c[0] = 'C';
    plVar3 = (long *)(local_c + 1);
    do {
      *(undefined1 *)plVar3 = 0;
      plVar3 = (long *)((long)plVar3 + 1);
    } while (plVar3 != &local_8);
  }
  else {
    this = std::array<LanguageCodeEntry,_347UL>::operator[]
                     ((array<LanguageCodeEntry,_347UL> *)&DAT_aaaaaaaaaaaaaaaa,
                      in_stack_ffffffffffffffd8);
    bVar1 = QFlags<QLocale::LanguageCodeType>::testFlag
                      ((QFlags<QLocale::LanguageCodeType> *)in_stack_ffffffffffffffd0,
                       in_stack_ffffffffffffffcc);
    if ((bVar1) && (bVar1 = AlphaCode::isValid(&this->part1), bVar1)) {
      local_c = (undefined1  [4])AlphaCode::decode(in_stack_ffffffffffffffd0);
    }
    else {
      bVar1 = QFlags<QLocale::LanguageCodeType>::testFlag
                        ((QFlags<QLocale::LanguageCodeType> *)in_stack_ffffffffffffffd0,
                         in_stack_ffffffffffffffcc);
      if ((bVar1) && (bVar1 = AlphaCode::isValid(&this->part2B), bVar1)) {
        local_c = (undefined1  [4])AlphaCode::decode(in_stack_ffffffffffffffd0);
      }
      else {
        bVar1 = QFlags<QLocale::LanguageCodeType>::testFlag
                          ((QFlags<QLocale::LanguageCodeType> *)in_stack_ffffffffffffffd0,
                           in_stack_ffffffffffffffcc);
        if ((bVar1) && (bVar1 = AlphaCode::isValid(&this->part2T), bVar1)) {
          local_c = (undefined1  [4])AlphaCode::decode(in_stack_ffffffffffffffd0);
        }
        else {
          bVar1 = QFlags<QLocale::LanguageCodeType>::testFlag
                            ((QFlags<QLocale::LanguageCodeType> *)in_stack_ffffffffffffffd0,
                             in_stack_ffffffffffffffcc);
          if (bVar1) {
            local_c = (undefined1  [4])AlphaCode::decode(in_stack_ffffffffffffffd0);
          }
          else {
            memset(local_c,0,4);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  aVar2._M_elems[0] = local_c[0];
  aVar2._M_elems[1] = local_c[1];
  aVar2._M_elems[2] = local_c[2];
  aVar2._M_elems[3] = local_c[3];
  return (array<char,_4UL>)aVar2._M_elems;
}

Assistant:

std::array<char, 4> QLocalePrivate::languageToCode(QLocale::Language language,
                                                   QLocale::LanguageCodeTypes codeTypes)
{
    if (language == QLocale::AnyLanguage || language > QLocale::LastLanguage)
        return {};
    if (language == QLocale::C)
        return {'C'};

    const LanguageCodeEntry &i = languageCodeList[language];

    if (codeTypes.testFlag(QLocale::ISO639Part1) && i.part1.isValid())
        return i.part1.decode();

    if (codeTypes.testFlag(QLocale::ISO639Part2B) && i.part2B.isValid())
        return i.part2B.decode();

    if (codeTypes.testFlag(QLocale::ISO639Part2T) && i.part2T.isValid())
        return i.part2T.decode();

    if (codeTypes.testFlag(QLocale::ISO639Part3))
        return i.part3.decode();

    return {};
}